

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.h
# Opt level: O0

void __thiscall
RigidBodyDynamics::Constraint::addInBaumgarteStabilizationForces
          (Constraint *this,VectorNd *errPosSys,VectorNd *errVelSys,VectorNd *gammaSysOutput)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  long in_RDI;
  double dVar6;
  uint i;
  Scalar in_stack_ffffffffffffffa8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_stack_ffffffffffffffb0;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < *(uint *)(in_RDI + 0x30); local_24 = local_24 + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8);
    dVar1 = *pSVar3;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8);
    dVar2 = *pdVar4;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa8 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb0 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
         (in_stack_ffffffffffffffa8 * *pSVar3);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       (in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8);
    dVar6 = (double)in_stack_ffffffffffffffb0 * *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_ffffffffffffffb0,(Index)in_stack_ffffffffffffffa8);
    *pSVar5 = dVar1 * -2.0 * dVar2 + -dVar6 + *pSVar5;
  }
  return;
}

Assistant:

void addInBaumgarteStabilizationForces(const Math::VectorNd &errPosSys,
                                           const Math::VectorNd &errVelSys,
                                           Math::VectorNd &gammaSysOutput)
    {

      //Here a for loop is used rather than a block operation
      //to be compatible with SimpleMath.
      for(unsigned int i=0; i<sizeOfConstraint;++i){
        gammaSysOutput[rowInSystem+i] +=
              -2.*baumgarteParameters[0]*errVelSys[rowInSystem+i]
             -(baumgarteParameters[1]*baumgarteParameters[1]
              )*errPosSys[rowInSystem+i];
      }
    }